

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O1

void __thiscall icu_63::TimeZoneTransition::~TimeZoneTransition(TimeZoneTransition *this)

{
  void *in_RSI;
  
  ~TimeZoneTransition(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

TimeZoneTransition::~TimeZoneTransition() {
    if (fFrom != NULL) {
        delete fFrom;
    }
    if (fTo != NULL) {
        delete fTo;
    }
}